

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonLabelCompareEscaped(char *zLeft,u32 nLeft,int rawLeft,char *zRight,u32 nRight,int rawRight)

{
  byte bVar1;
  u32 uVar2;
  ulong uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  u32 cLeft;
  u32 local_40;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0xaaaaaaaa;
  local_40 = 0xaaaaaaaa;
  do {
    if (nLeft == 0) {
      local_3c = 0;
      nLeft = 0;
    }
    else {
      bVar1 = *zLeft;
      if ((rawLeft == 0) && (bVar1 == 0x5c)) {
        uVar2 = jsonUnescapeOneChar(zLeft,nLeft,&local_3c);
        zLeft = (char *)((byte *)zLeft + uVar2);
        nLeft = nLeft - uVar2;
      }
      else {
        local_3c = (u32)bVar1;
        if (bVar1 < 0xc0) {
          zLeft = (char *)((byte *)zLeft + 1);
          nLeft = nLeft - 1;
        }
        else {
          bVar1 = *zLeft;
          local_3c = (u32)bVar1;
          uVar3 = 1;
          if (0xbf < bVar1) {
            local_3c = (u32)""[bVar1 - 0xc0];
            uVar4 = 4;
            if ((int)nLeft < 4) {
              uVar4 = nLeft;
            }
            if (1 < (int)nLeft) {
              uVar3 = 1;
              do {
                if ((((byte *)zLeft)[uVar3] & 0xffffffc0) != 0x80) goto LAB_001bb0f1;
                local_3c = ((byte *)zLeft)[uVar3] & 0x3f | local_3c << 6;
                uVar3 = uVar3 + 1;
              } while (uVar4 != uVar3);
              uVar3 = (ulong)uVar4;
            }
          }
LAB_001bb0f1:
          zLeft = (char *)((byte *)zLeft + (int)uVar3);
          nLeft = nLeft - (int)uVar3;
        }
      }
    }
    if (nRight == 0) {
      uVar4 = (uint)(local_3c == 0);
      goto LAB_001bb1e0;
    }
    bVar1 = *zRight;
    if ((rawRight == 0) && (bVar1 == 0x5c)) {
      uVar2 = jsonUnescapeOneChar(zRight,nRight,&local_40);
      zRight = (char *)((byte *)zRight + uVar2);
      nRight = nRight - uVar2;
    }
    else {
      local_40 = (u32)bVar1;
      if (bVar1 < 0xc0) {
        zRight = (char *)((byte *)zRight + 1);
        nRight = nRight - 1;
      }
      else {
        bVar1 = *zRight;
        local_40 = (u32)bVar1;
        uVar3 = 1;
        if (0xbf < bVar1) {
          local_40 = (u32)""[bVar1 - 0xc0];
          uVar4 = 4;
          if ((int)nRight < 4) {
            uVar4 = nRight;
          }
          if (1 < (int)nRight) {
            uVar3 = 1;
            do {
              if ((((byte *)zRight)[uVar3] & 0xffffffc0) != 0x80) goto LAB_001bb1aa;
              local_40 = ((byte *)zRight)[uVar3] & 0x3f | local_40 << 6;
              uVar3 = uVar3 + 1;
            } while (uVar4 != uVar3);
            uVar3 = (ulong)uVar4;
          }
        }
LAB_001bb1aa:
        zRight = (char *)((byte *)zRight + (int)uVar3);
        nRight = nRight - (int)uVar3;
      }
    }
    if (local_3c != local_40) {
      uVar4 = 0;
      goto LAB_001bb1e0;
    }
  } while (local_40 != 0);
  uVar4 = 1;
LAB_001bb1e0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE int jsonLabelCompareEscaped(
  const char *zLeft,          /* The left label */
  u32 nLeft,                  /* Size of the left label in bytes */
  int rawLeft,                /* True if zLeft contains no escapes */
  const char *zRight,         /* The right label */
  u32 nRight,                 /* Size of the right label in bytes */
  int rawRight                /* True if zRight is escape-free */
){
  u32 cLeft, cRight;
  assert( rawLeft==0 || rawRight==0 );
  while( 1 /*exit-by-return*/ ){
    if( nLeft==0 ){
      cLeft = 0;
    }else if( rawLeft || zLeft[0]!='\\' ){
      cLeft = ((u8*)zLeft)[0];
      if( cLeft>=0xc0 ){
        int sz = sqlite3Utf8ReadLimited((u8*)zLeft, nLeft, &cLeft);
        zLeft += sz;
        nLeft -= sz;
      }else{
        zLeft++;
        nLeft--;
      }
    }else{
      u32 n = jsonUnescapeOneChar(zLeft, nLeft, &cLeft);
      zLeft += n;
      assert( n<=nLeft );
      nLeft -= n;
    }
    if( nRight==0 ){
      cRight = 0;
    }else if( rawRight || zRight[0]!='\\' ){
      cRight = ((u8*)zRight)[0];
      if( cRight>=0xc0 ){
        int sz = sqlite3Utf8ReadLimited((u8*)zRight, nRight, &cRight);
        zRight += sz;
        nRight -= sz;
      }else{
        zRight++;
        nRight--;
      }
    }else{
      u32 n = jsonUnescapeOneChar(zRight, nRight, &cRight);
      zRight += n;
      assert( n<=nRight );
      nRight -= n;
    }
    if( cLeft!=cRight ) return 0;
    if( cLeft==0 ) return 1;
  }
}